

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngpread.c
# Opt level: O1

void png_push_read_IDAT(png_structrp png_ptr)

{
  byte *pbVar1;
  ulong uVar2;
  png_uint_32 pVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  png_byte chunk_tag [4];
  png_byte chunk_length [4];
  uint local_20;
  png_byte local_1c [4];
  
  if ((png_ptr->mode & 0x100) == 0) {
    if (png_ptr->buffer_size < 8) goto LAB_0010ba28;
    png_push_fill_buffer(png_ptr,local_1c,4);
    pVar3 = png_get_uint_31(png_ptr,local_1c);
    png_ptr->push_length = pVar3;
    png_reset_crc(png_ptr);
    png_crc_read(png_ptr,(png_bytep)&local_20,4);
    uVar4 = local_20 >> 0x18 | (local_20 & 0xff0000) >> 8 | (local_20 & 0xff00) << 8 |
            local_20 << 0x18;
    png_ptr->chunk_name = uVar4;
    pbVar1 = (byte *)((long)&png_ptr->mode + 1);
    *pbVar1 = *pbVar1 | 1;
    if (uVar4 != 0x49444154) {
      png_ptr->process_mode = 1;
      if ((png_ptr->flags & 8) != 0) {
        return;
      }
      png_error(png_ptr,"Not enough compressed data");
    }
    png_ptr->idat_size = png_ptr->push_length;
  }
  uVar5 = (ulong)png_ptr->idat_size;
  if ((uVar5 != 0) && (uVar2 = png_ptr->save_buffer_size, uVar2 != 0)) {
    uVar6 = uVar5;
    if (uVar2 < uVar5) {
      uVar6 = uVar2;
    }
    uVar4 = (uint)uVar2;
    if (uVar5 < uVar2) {
      uVar4 = png_ptr->idat_size;
    }
    png_calculate_crc(png_ptr,png_ptr->save_buffer_ptr,uVar6);
    png_process_IDAT_data(png_ptr,png_ptr->save_buffer_ptr,uVar6);
    png_ptr->idat_size = png_ptr->idat_size - uVar4;
    png_ptr->buffer_size = png_ptr->buffer_size - uVar6;
    png_ptr->save_buffer_size = png_ptr->save_buffer_size - uVar6;
    png_ptr->save_buffer_ptr = png_ptr->save_buffer_ptr + uVar6;
  }
  uVar5 = (ulong)png_ptr->idat_size;
  if ((uVar5 != 0) && (uVar2 = png_ptr->current_buffer_size, uVar2 != 0)) {
    uVar6 = uVar5;
    if (uVar2 < uVar5) {
      uVar6 = uVar2;
    }
    uVar4 = (uint)uVar2;
    if (uVar5 < uVar2) {
      uVar4 = png_ptr->idat_size;
    }
    png_calculate_crc(png_ptr,png_ptr->current_buffer_ptr,uVar6);
    png_process_IDAT_data(png_ptr,png_ptr->current_buffer_ptr,uVar6);
    png_ptr->idat_size = png_ptr->idat_size - uVar4;
    png_ptr->buffer_size = png_ptr->buffer_size - uVar6;
    png_ptr->current_buffer_size = png_ptr->current_buffer_size - uVar6;
    png_ptr->current_buffer_ptr = png_ptr->current_buffer_ptr + uVar6;
  }
  if (png_ptr->idat_size != 0) {
    return;
  }
  if (3 < png_ptr->buffer_size) {
    png_crc_finish(png_ptr,0);
    png_ptr->mode = png_ptr->mode & 0xfffffef7 | 8;
    png_ptr->zowner = 0;
    return;
  }
LAB_0010ba28:
  png_push_save_buffer(png_ptr);
  return;
}

Assistant:

void /* PRIVATE */
png_push_read_IDAT(png_structrp png_ptr)
{
   if ((png_ptr->mode & PNG_HAVE_CHUNK_HEADER) == 0)
   {
      png_byte chunk_length[4];
      png_byte chunk_tag[4];

      /* TODO: this code can be commoned up with the same code in push_read */
      PNG_PUSH_SAVE_BUFFER_IF_LT(8)
      png_push_fill_buffer(png_ptr, chunk_length, 4);
      png_ptr->push_length = png_get_uint_31(png_ptr, chunk_length);
      png_reset_crc(png_ptr);
      png_crc_read(png_ptr, chunk_tag, 4);
      png_ptr->chunk_name = PNG_CHUNK_FROM_STRING(chunk_tag);
      png_ptr->mode |= PNG_HAVE_CHUNK_HEADER;

      if (png_ptr->chunk_name != png_IDAT)
      {
         png_ptr->process_mode = PNG_READ_CHUNK_MODE;

         if ((png_ptr->flags & PNG_FLAG_ZSTREAM_ENDED) == 0)
            png_error(png_ptr, "Not enough compressed data");

         return;
      }

      png_ptr->idat_size = png_ptr->push_length;
   }

   if (png_ptr->idat_size != 0 && png_ptr->save_buffer_size != 0)
   {
      size_t save_size = png_ptr->save_buffer_size;
      png_uint_32 idat_size = png_ptr->idat_size;

      /* We want the smaller of 'idat_size' and 'current_buffer_size', but they
       * are of different types and we don't know which variable has the fewest
       * bits.  Carefully select the smaller and cast it to the type of the
       * larger - this cannot overflow.  Do not cast in the following test - it
       * will break on either 16-bit or 64-bit platforms.
       */
      if (idat_size < save_size)
         save_size = (size_t)idat_size;

      else
         idat_size = (png_uint_32)save_size;

      png_calculate_crc(png_ptr, png_ptr->save_buffer_ptr, save_size);

      png_process_IDAT_data(png_ptr, png_ptr->save_buffer_ptr, save_size);

      png_ptr->idat_size -= idat_size;
      png_ptr->buffer_size -= save_size;
      png_ptr->save_buffer_size -= save_size;
      png_ptr->save_buffer_ptr += save_size;
   }

   if (png_ptr->idat_size != 0 && png_ptr->current_buffer_size != 0)
   {
      size_t save_size = png_ptr->current_buffer_size;
      png_uint_32 idat_size = png_ptr->idat_size;

      /* We want the smaller of 'idat_size' and 'current_buffer_size', but they
       * are of different types and we don't know which variable has the fewest
       * bits.  Carefully select the smaller and cast it to the type of the
       * larger - this cannot overflow.
       */
      if (idat_size < save_size)
         save_size = (size_t)idat_size;

      else
         idat_size = (png_uint_32)save_size;

      png_calculate_crc(png_ptr, png_ptr->current_buffer_ptr, save_size);

      png_process_IDAT_data(png_ptr, png_ptr->current_buffer_ptr, save_size);

      png_ptr->idat_size -= idat_size;
      png_ptr->buffer_size -= save_size;
      png_ptr->current_buffer_size -= save_size;
      png_ptr->current_buffer_ptr += save_size;
   }

   if (png_ptr->idat_size == 0)
   {
      PNG_PUSH_SAVE_BUFFER_IF_LT(4)
      png_crc_finish(png_ptr, 0);
      png_ptr->mode &= ~PNG_HAVE_CHUNK_HEADER;
      png_ptr->mode |= PNG_AFTER_IDAT;
      png_ptr->zowner = 0;
   }
}